

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void unpackforblock28(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  uint64_t *pw64;
  uint64_t w13;
  uint64_t w12;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t mask;
  uint32_t *out;
  
  puVar1 = (ulong *)*in_RSI;
  piVar2 = (int *)*in_RDX;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  uVar12 = puVar1[9];
  uVar13 = puVar1[10];
  uVar14 = puVar1[0xb];
  uVar15 = puVar1[0xc];
  uVar16 = puVar1[0xd];
  *in_RSI = *in_RSI + 0x70;
  *piVar2 = in_EDI + ((uint)uVar3 & 0xfffffff);
  piVar2[1] = in_EDI + ((uint)(uVar3 >> 0x1c) & 0xfffffff);
  piVar2[2] = in_EDI + ((uint)(byte)(uVar3 >> 0x38) | (uint)(uVar4 << 8) & 0xfffffff);
  piVar2[3] = in_EDI + ((uint)(uVar4 >> 0x14) & 0xfffffff);
  piVar2[4] = in_EDI + ((uint)(ushort)(uVar4 >> 0x30) | (uint)(uVar5 << 0x10) & 0xfffffff);
  piVar2[5] = in_EDI + ((uint)(uVar5 >> 0xc) & 0xfffffff);
  piVar2[6] = in_EDI + ((uint)(uVar5 >> 0x28) | (uint)(uVar6 << 0x18) & 0xfffffff);
  piVar2[7] = in_EDI + ((uint)(uVar6 >> 4) & 0xfffffff);
  uVar17 = (uint)(uVar6 >> 0x20);
  piVar2[8] = in_EDI + (uVar17 & 0xfffffff);
  piVar2[9] = in_EDI + (uVar17 >> 0x1c | (uint)(uVar7 << 4) & 0xfffffff);
  piVar2[10] = in_EDI + ((uint)(uVar7 >> 0x18) & 0xfffffff);
  piVar2[0xb] = in_EDI + ((uint)(uVar7 >> 0x34) | (uint)(uVar8 << 0xc) & 0xfffffff);
  piVar2[0xc] = in_EDI + ((uint)(uVar8 >> 0x10) & 0xfffffff);
  piVar2[0xd] = in_EDI + ((uint)(uVar8 >> 0x2c) | (uint)(uVar9 << 0x14) & 0xfffffff);
  piVar2[0xe] = in_EDI + ((uint)(uVar9 >> 8) & 0xfffffff);
  piVar2[0xf] = in_EDI + (uint)(uVar9 >> 0x24);
  piVar2[0x10] = in_EDI + ((uint)uVar10 & 0xfffffff);
  piVar2[0x11] = in_EDI + ((uint)(uVar10 >> 0x1c) & 0xfffffff);
  piVar2[0x12] = in_EDI + ((uint)(byte)(uVar10 >> 0x38) | (uint)(uVar11 << 8) & 0xfffffff);
  piVar2[0x13] = in_EDI + ((uint)(uVar11 >> 0x14) & 0xfffffff);
  piVar2[0x14] = in_EDI + ((uint)(ushort)(uVar11 >> 0x30) | (uint)(uVar12 << 0x10) & 0xfffffff);
  piVar2[0x15] = in_EDI + ((uint)(uVar12 >> 0xc) & 0xfffffff);
  piVar2[0x16] = in_EDI + ((uint)(uVar12 >> 0x28) | (uint)(uVar13 << 0x18) & 0xfffffff);
  piVar2[0x17] = in_EDI + ((uint)(uVar13 >> 4) & 0xfffffff);
  uVar17 = (uint)(uVar13 >> 0x20);
  piVar2[0x18] = in_EDI + (uVar17 & 0xfffffff);
  piVar2[0x19] = in_EDI + (uVar17 >> 0x1c | (uint)(uVar14 << 4) & 0xfffffff);
  piVar2[0x1a] = in_EDI + ((uint)(uVar14 >> 0x18) & 0xfffffff);
  piVar2[0x1b] = in_EDI + ((uint)(uVar14 >> 0x34) | (uint)(uVar15 << 0xc) & 0xfffffff);
  piVar2[0x1c] = in_EDI + ((uint)(uVar15 >> 0x10) & 0xfffffff);
  piVar2[0x1d] = in_EDI + ((uint)(uVar15 >> 0x2c) | (uint)(uVar16 << 0x14) & 0xfffffff);
  piVar2[0x1e] = in_EDI + ((uint)(uVar16 >> 8) & 0xfffffff);
  piVar2[0x1f] = in_EDI + (uint)(uVar16 >> 0x24);
  *in_RDX = *in_RDX + 0x80;
  return;
}

Assistant:

static void unpackforblock28(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(268435455);
  /* we are going to access  14 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  *pw += 112; /* we used up 112 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 28) & mask);
  out[2] = base + (uint32_t)(((w0 >> 56) | (w1 << 8)) & mask);
  out[3] = base + (uint32_t)((w1 >> 20) & mask);
  out[4] = base + (uint32_t)(((w1 >> 48) | (w2 << 16)) & mask);
  out[5] = base + (uint32_t)((w2 >> 12) & mask);
  out[6] = base + (uint32_t)(((w2 >> 40) | (w3 << 24)) & mask);
  out[7] = base + (uint32_t)((w3 >> 4) & mask);
  out[8] = base + (uint32_t)((w3 >> 32) & mask);
  out[9] = base + (uint32_t)(((w3 >> 60) | (w4 << 4)) & mask);
  out[10] = base + (uint32_t)((w4 >> 24) & mask);
  out[11] = base + (uint32_t)(((w4 >> 52) | (w5 << 12)) & mask);
  out[12] = base + (uint32_t)((w5 >> 16) & mask);
  out[13] = base + (uint32_t)(((w5 >> 44) | (w6 << 20)) & mask);
  out[14] = base + (uint32_t)((w6 >> 8) & mask);
  out[15] = base + (uint32_t)(w6 >> 36);
  out[16] = base + (uint32_t)((w7)&mask);
  out[17] = base + (uint32_t)((w7 >> 28) & mask);
  out[18] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[19] = base + (uint32_t)((w8 >> 20) & mask);
  out[20] = base + (uint32_t)(((w8 >> 48) | (w9 << 16)) & mask);
  out[21] = base + (uint32_t)((w9 >> 12) & mask);
  out[22] = base + (uint32_t)(((w9 >> 40) | (w10 << 24)) & mask);
  out[23] = base + (uint32_t)((w10 >> 4) & mask);
  out[24] = base + (uint32_t)((w10 >> 32) & mask);
  out[25] = base + (uint32_t)(((w10 >> 60) | (w11 << 4)) & mask);
  out[26] = base + (uint32_t)((w11 >> 24) & mask);
  out[27] = base + (uint32_t)(((w11 >> 52) | (w12 << 12)) & mask);
  out[28] = base + (uint32_t)((w12 >> 16) & mask);
  out[29] = base + (uint32_t)(((w12 >> 44) | (w13 << 20)) & mask);
  out[30] = base + (uint32_t)((w13 >> 8) & mask);
  out[31] = base + (uint32_t)(w13 >> 36);
  *pout += 32; /* we wrote 32 32-bit integers */
}